

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O1

void __thiscall MT32Emu::RhythmPart::noteOn(RhythmPart *this,uint midiKey,uint velocity)

{
  uint uVar1;
  byte bVar2;
  MemParams *pMVar3;
  uint uVar4;
  uint uVar5;
  char *fmt;
  Synth *this_00;
  
  this_00 = (this->super_Part).synth;
  if (midiKey - 0x6d < 0xffffffab) {
    fmt = "%s: Attempted to play invalid key %d (velocity %d)";
LAB_0011c020:
    Synth::printDebug(this_00,fmt,(this->super_Part).name,(ulong)midiKey,(ulong)velocity);
    return;
  }
  Synth::rhythmNotePlayed(this_00);
  uVar1 = midiKey - 0x18;
  bVar2 = this->rhythmTemp[uVar1].timbre;
  if ((bVar2 == 0x7f) ||
     (uVar4 = ((this->super_Part).synth)->controlROMMap->timbreRCount + 0x40, uVar5 = (uint)bVar2,
     uVar4 < bVar2 || uVar4 == uVar5)) {
    this_00 = (this->super_Part).synth;
    fmt = "%s: Attempted to play unmapped key %d (velocity %d)";
    goto LAB_0011c020;
  }
  if (uVar5 == 0x46) {
    uVar4 = 1;
  }
  else {
    uVar4 = midiKey;
    if (uVar5 != 0x47) goto LAB_0011c04f;
    uVar4 = 0;
  }
  (*(this->super_Part)._vptr_Part[3])(this,0);
LAB_0011c04f:
  pMVar3 = ((this->super_Part).synth)->mt32ram;
  *(undefined2 *)((this->super_Part).currentInstr + 8) =
       *(undefined2 *)(pMVar3->timbres[(ulong)bVar2 + 0x80].timbre.common.name + 8);
  *(undefined8 *)(this->super_Part).currentInstr =
       *(undefined8 *)pMVar3->timbres[(ulong)bVar2 + 0x80].timbre.common.name;
  if (this->drumCache[uVar1][0].dirty == true) {
    Part::cacheTimbre(&this->super_Part,this->drumCache[uVar1],
                      &pMVar3->timbres[(ulong)bVar2 + 0x80].timbre);
  }
  Part::playPoly(&this->super_Part,this->drumCache[uVar1],this->rhythmTemp + uVar1,midiKey,uVar4,
                 velocity);
  return;
}

Assistant:

void RhythmPart::noteOn(unsigned int midiKey, unsigned int velocity) {
	if (midiKey < 24 || midiKey > 108) { /*> 87 on MT-32)*/
		synth->printDebug("%s: Attempted to play invalid key %d (velocity %d)", name, midiKey, velocity);
		return;
	}
	synth->rhythmNotePlayed();
	unsigned int key = midiKey;
	unsigned int drumNum = key - 24;
	int drumTimbreNum = rhythmTemp[drumNum].timbre;
	const int drumTimbreCount = 64 + synth->controlROMMap->timbreRCount; // 94 on MT-32, 128 on LAPC-I/CM32-L
	if (drumTimbreNum == 127 || drumTimbreNum >= drumTimbreCount) { // timbre #127 is OFF, no sense to play it
		synth->printDebug("%s: Attempted to play unmapped key %d (velocity %d)", name, midiKey, velocity);
		return;
	}
	// CONFIRMED: Two special cases described by Mok
	if (drumTimbreNum == 64 + 6) {
		noteOff(0);
		key = 1;
	} else if (drumTimbreNum == 64 + 7) {
		// This noteOff(0) is not performed on MT-32, only LAPC-I
		noteOff(0);
		key = 0;
	}
	int absTimbreNum = drumTimbreNum + 128;
	TimbreParam *timbre = &synth->mt32ram.timbres[absTimbreNum].timbre;
	memcpy(currentInstr, timbre->common.name, 10);
	if (drumCache[drumNum][0].dirty) {
		cacheTimbre(drumCache[drumNum], timbre);
	}
#if MT32EMU_MONITOR_INSTRUMENTS > 0
	synth->printDebug("%s (%s): Start poly (drum %d, timbre %d): midiKey %u, key %u, velo %u, mod %u, exp %u, bend %u", name, currentInstr, drumNum, absTimbreNum, midiKey, key, velocity, modulation, expression, pitchBend);
#if MT32EMU_MONITOR_INSTRUMENTS > 1
	// According to info from Mok, keyShift does not appear to affect anything on rhythm part on LAPC-I, but may do on MT-32 - needs investigation
	synth->printDebug(" Patch: (timbreGroup %u), (timbreNum %u), (keyShift %u), fineTune %u, benderRange %u, assignMode %u, (reverbSwitch %u)", patchTemp->patch.timbreGroup, patchTemp->patch.timbreNum, patchTemp->patch.keyShift, patchTemp->patch.fineTune, patchTemp->patch.benderRange, patchTemp->patch.assignMode, patchTemp->patch.reverbSwitch);
	synth->printDebug(" PatchTemp: outputLevel %u, (panpot %u)", patchTemp->outputLevel, patchTemp->panpot);
	synth->printDebug(" RhythmTemp: timbre %u, outputLevel %u, panpot %u, reverbSwitch %u", rhythmTemp[drumNum].timbre, rhythmTemp[drumNum].outputLevel, rhythmTemp[drumNum].panpot, rhythmTemp[drumNum].reverbSwitch);
#endif
#endif
	playPoly(drumCache[drumNum], &rhythmTemp[drumNum], midiKey, key, velocity);
}